

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void CTPNPreInc_gen_code(CTcPrsNode *sub,int discard)

{
  int iVar1;
  undefined4 in_register_00000034;
  void *ctx;
  
  iVar1 = (*(sub->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x12])
                    (sub,CONCAT44(in_register_00000034,discard),1,0xc,"++",0,0,1,&ctx);
  if (iVar1 == 0) {
    CTcGenTarg::write_op(G_cg,'.');
    (*(sub->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x12])(sub,discard,2,0xc,"++",0,0,1,&ctx);
  }
  return;
}

Assistant:

void CTPNPreInc_gen_code(CTcPrsNode *sub, int discard)
{
    /* ask the subnode to generate it */
    void *ctx;
    if (!sub->gen_code_asi(discard, 1, TC_ASI_PREINC, "++",
                           0, FALSE, TRUE, &ctx))
    {
        /* increment the value at top of stack */
        G_cg->write_op(OPC_INC);

        /* 
         *   generate a simple assignment back to the subexpression; if
         *   we're using the value, let the simple assignment leave its
         *   value on the stack, since the result is the value *after* the
         *   increment 
         */
        sub->gen_code_asi(discard, 2, TC_ASI_PREINC, "++",
                          0, FALSE, TRUE, &ctx);
    }
}